

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection_segment.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnDataCollectionSegment::ColumnDataCollectionSegment
          (ColumnDataCollectionSegment *this,
          shared_ptr<duckdb::ColumnDataAllocator,_true> *allocator_p,
          vector<duckdb::LogicalType,_true> *types_p)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pLVar3;
  ColumnDataAllocator *this_00;
  
  (this->allocator).internal.
  super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (allocator_p->internal).
           super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (allocator_p->internal).
           super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (allocator_p->internal).
  super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->allocator).internal.
  super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->allocator).internal.
  super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  (allocator_p->internal).
  super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  pLVar3 = (types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       (types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = pLVar3;
  (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->child_indices).
  super_vector<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>.
  super__Vector_base<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->child_indices).
  super_vector<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>.
  super__Vector_base<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vector_data).super_vector<duckdb::VectorMetaData,_std::allocator<duckdb::VectorMetaData>_>.
  super__Vector_base<duckdb::VectorMetaData,_std::allocator<duckdb::VectorMetaData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->child_indices).
  super_vector<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>.
  super__Vector_base<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vector_data).super_vector<duckdb::VectorMetaData,_std::allocator<duckdb::VectorMetaData>_>.
  super__Vector_base<duckdb::VectorMetaData,_std::allocator<duckdb::VectorMetaData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vector_data).super_vector<duckdb::VectorMetaData,_std::allocator<duckdb::VectorMetaData>_>.
  super__Vector_base<duckdb::VectorMetaData,_std::allocator<duckdb::VectorMetaData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->chunk_data).super_vector<duckdb::ChunkMetaData,_std::allocator<duckdb::ChunkMetaData>_>.
  super__Vector_base<duckdb::ChunkMetaData,_std::allocator<duckdb::ChunkMetaData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->chunk_data).super_vector<duckdb::ChunkMetaData,_std::allocator<duckdb::ChunkMetaData>_>.
  super__Vector_base<duckdb::ChunkMetaData,_std::allocator<duckdb::ChunkMetaData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->count = 0;
  (this->chunk_data).super_vector<duckdb::ChunkMetaData,_std::allocator<duckdb::ChunkMetaData>_>.
  super__Vector_base<duckdb::ChunkMetaData,_std::allocator<duckdb::ChunkMetaData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this_00 = shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->(&this->allocator);
  ColumnDataAllocator::GetAllocator(this_00);
  make_shared_ptr<duckdb::StringHeap,duckdb::Allocator&>((Allocator *)&this->heap);
  return;
}

Assistant:

ColumnDataCollectionSegment::ColumnDataCollectionSegment(shared_ptr<ColumnDataAllocator> allocator_p,
                                                         vector<LogicalType> types_p)
    : allocator(std::move(allocator_p)), types(std::move(types_p)), count(0),
      heap(make_shared_ptr<StringHeap>(allocator->GetAllocator())) {
}